

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrency.cpp
# Opt level: O3

void phyr::ParallelFor(function<void_(long)> *func,int64_t count,int chunkSize)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  _func_void *p_Var4;
  ulong uVar5;
  unique_lock<std::mutex> lock;
  ulong local_c0;
  _Any_data local_b8;
  _Manager_type local_a8;
  _Invoker_type local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  ulong local_78;
  int local_70;
  ulong local_68;
  int local_60;
  _Any_data *local_58;
  int local_50;
  unique_lock<std::mutex> local_40;
  
  if ((count < chunkSize) || (threads == DAT_001adc38)) {
    if (0 < count) {
      p_Var4 = (_func_void *)0x0;
      do {
        local_b8._M_unused._M_function_pointer = p_Var4;
        if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00129199;
        (*func->_M_invoker)((_Any_data *)func,(long *)local_b8._M_pod_data);
        p_Var4 = p_Var4 + 1;
      } while ((_func_void *)count != p_Var4);
    }
  }
  else {
    local_a8 = (func->super__Function_base)._M_manager;
    local_a0 = func->_M_invoker;
    if (local_a8 == (_Manager_type)0x0) {
      local_b8._M_unused._M_object = (_func_void *)0x0;
      local_b8._8_8_ = 0;
      local_a8 = (_Manager_type)0x0;
    }
    else {
      (func->super__Function_base)._M_manager = (_Manager_type)0x0;
      func->_M_invoker = (_Invoker_type)0x0;
      local_b8._M_unused._0_8_ = (undefined8)*(undefined8 *)&(func->super__Function_base)._M_functor
      ;
      local_b8._8_8_ = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
    }
    local_88 = (code *)0x0;
    pcStack_80 = (code *)0x0;
    local_98 = 0;
    uStack_90 = 0;
    local_68 = 0;
    local_60 = 0;
    local_58 = (_Any_data *)0x0;
    local_50 = -1;
    local_78 = count;
    local_70 = chunkSize;
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)workListMutex);
    if (iVar1 != 0) goto LAB_0012919e;
    local_58 = workList;
    workList = &local_b8;
    pthread_mutex_unlock((pthread_mutex_t *)workListMutex);
    local_40._M_device = (mutex_type *)workListMutex;
    local_40._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    std::condition_variable::notify_all();
    iVar1 = local_60;
    if ((long)local_68 < (long)local_78 || local_60 != 0) {
      local_60 = local_60 + 1;
      uVar5 = local_68;
      do {
        uVar2 = (long)local_70 + uVar5;
        uVar3 = uVar2;
        if ((long)local_78 < (long)uVar2) {
          uVar3 = local_78;
        }
        if ((long)local_78 <= (long)uVar2) {
          workList = local_58;
        }
        local_68 = uVar3;
        std::unique_lock<std::mutex>::unlock(&local_40);
        if ((long)uVar5 < (long)uVar3) {
          do {
            if (local_a8 == (_Manager_type)0x0) {
              local_c0 = (long)uVar5 % (long)local_50 & 0xffffffffU |
                         (long)uVar5 / (long)local_50 << 0x20;
              if (local_88 == (code *)0x0) {
                std::__throw_bad_function_call();
                goto LAB_00129199;
              }
              (*pcStack_80)(&local_98,&local_c0);
            }
            else {
              local_c0 = uVar5;
              (*local_a0)(&local_b8,(long *)&local_c0);
            }
            uVar5 = uVar5 + 1;
          } while (uVar3 != uVar5);
        }
        std::unique_lock<std::mutex>::lock(&local_40);
        uVar5 = local_68;
        iVar1 = local_60 + -1;
      } while ((long)local_68 < (long)local_78 || local_60 + -1 != 0);
    }
    local_60 = iVar1;
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,3);
    }
    if (local_a8 != (_Manager_type)0x0) {
      (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    }
  }
  return;
LAB_00129199:
  iVar1 = std::__throw_bad_function_call();
LAB_0012919e:
  std::__throw_system_error(iVar1);
}

Assistant:

void ParallelFor(std::function<void(int64_t)> func, int64_t count, int chunkSize) {
    ASSERT(threads.size() > 0 || maxThreadIndex() == 1);

    // Run iterations immediately if not using threads or if _count_ is small
    if (threads.empty() || count < chunkSize) {
        for (int64_t i = 0; i < count; ++i) func(i);
        return;
    }

    // Create and enqueue _ParallelForLoop_ for this loop
    ParallelForLoop loop(std::move(func), count, chunkSize);
    workListMutex.lock();
    loop.next = workList;
    workList = &loop;
    workListMutex.unlock();

    // Notify worker threads of work to be done
    std::unique_lock<std::mutex> lock(workListMutex);
    workListCondition.notify_all();

    // Help out with parallel loop iterations in the current thread
    while (!loop.finished()) {
        // Run a chunk of loop iterations for _loop_

        // Find the set of loop iterations to run next
        int64_t indexStart = loop.nextIndex;
        int64_t indexEnd = std::min(indexStart + loop.chunkSize, loop.maxIndex);

        // Update _loop_ to reflect iterations this thread will run
        loop.nextIndex = indexEnd;
        if (loop.nextIndex == loop.maxIndex) workList = loop.next;
        loop.activeWorkers++;

        // Run loop indices in _[indexStart, indexEnd)_
        lock.unlock();
        for (int64_t index = indexStart; index < indexEnd; ++index) {
            if (loop.func1D) {
                loop.func1D(index);
            }
            // Handle other types of loops
            else {
                ASSERT(loop.func2D);
                loop.func2D(Point2i(index % loop.nX, index / loop.nX));
            }
        }
        lock.lock();

        // Update _loop_ to reflect completion of iterations
        loop.activeWorkers--;
    }
}